

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Preface * __thiscall ASDCP::MXF::Preface::WriteToTLVSet(Preface *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVWriter local_4b0;
  TLVWriter local_448;
  TLVWriter local_3e0;
  TLVWriter local_378;
  TLVWriter local_310;
  TLVWriter local_2a8;
  TLVWriter local_240;
  TLVWriter local_1d8;
  TLVWriter local_170;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  Preface *this_local;
  Result_t *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  TLVSet_local = TLVSet;
  this_local = this;
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_LastModifiedDate);
    TLVWriter::WriteObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Preface_Version);
    TLVWriter::WriteUi16(&local_108,pMVar4,(ui16_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_int>::empty
                        ((optional_property<unsigned_int> *)
                         ((long)&TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header
                                 ._M_left + 4)), pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_ObjectModelVersion);
    optional_property<unsigned_int>::get
              ((optional_property<unsigned_int> *)
               ((long)&TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
               4));
    TLVWriter::WriteUi32(&local_170,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_PrimaryPackage);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVWriter::WriteObject(&local_1d8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_Identifications);
    TLVWriter::WriteObject(&local_240,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_ContentStorage);
    TLVWriter::WriteObject(&local_2a8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Core_OperationalPattern);
    TLVWriter::WriteObject(&local_310,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Core_EssenceContainers);
    TLVWriter::WriteObject(&local_378,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Preface_DMSchemes);
    TLVWriter::WriteObject(&local_3e0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::empty
                        ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
                         &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent), pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_ApplicationSchemes);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::get
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVWriter::WriteObject(&local_448,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::empty
                        ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
                         &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent), !bVar1)) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_ConformsToSpecifications);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::get
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVWriter::WriteObject(&local_4b0,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_4b0);
    Kumu::Result_t::~Result_t((Result_t *)&local_4b0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Preface::WriteToTLVSet(TLVWriter& TLVSet)
{
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, LastModifiedDate));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteUi16(OBJ_WRITE_ARGS(Preface, Version));
  if ( ASDCP_SUCCESS(result) && ! ObjectModelVersion.empty() )  result = TLVSet.WriteUi32(OBJ_WRITE_ARGS_OPT(Preface, ObjectModelVersion));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, PrimaryPackage));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, Identifications));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, ContentStorage));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, OperationalPattern));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, EssenceContainers));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, DMSchemes));
  if ( ASDCP_SUCCESS(result) && !ApplicationSchemes.empty() )
    {
      result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, ApplicationSchemes));
    }
  if ( ASDCP_SUCCESS(result) && !ConformsToSpecifications.empty())
    {
      result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, ConformsToSpecifications));
    }
  return result;
}